

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O0

GLFWwindow *
glfwCreateWindow(int width,int height,char *title,GLFWmonitor *monitor,GLFWwindow *share)

{
  GLboolean GVar1;
  wchar_t wVar2;
  int local_d8;
  int local_d4;
  int height_1;
  int width_1;
  _GLFWwindow *previous;
  _GLFWwindow *window;
  _GLFWwndconfig wndconfig;
  _GLFWctxconfig ctxconfig;
  _GLFWfbconfig fbconfig;
  GLFWwindow *share_local;
  GLFWmonitor *monitor_local;
  char *title_local;
  int height_local;
  int width_local;
  
  if (_glfwInitialized == '\0') {
    _glfwInputError(0x10001,(char *)0x0);
    _height_local = (_GLFWwindow *)0x0;
  }
  else if ((width < 1) || (height < 1)) {
    _glfwInputError(0x10004,"Invalid window size");
    _height_local = (_GLFWwindow *)0x0;
  }
  else {
    ctxconfig.share._0_4_ = _glfw.hints.redBits;
    ctxconfig.share._4_4_ = _glfw.hints.greenBits;
    wndconfig.title._0_1_ = _glfw.hints.resizable != 0;
    wndconfig.title._1_1_ = _glfw.hints.visible != 0;
    wndconfig.title._2_1_ = _glfw.hints.decorated != 0;
    wndconfig.title._3_1_ = _glfw.hints.focused != 0;
    wndconfig.title._4_1_ = _glfw.hints.autoIconify != 0;
    wndconfig.title._5_1_ = _glfw.hints.floating != 0;
    wndconfig.monitor._0_4_ = _glfw.hints.api;
    wndconfig.monitor._4_4_ = _glfw.hints.major;
    ctxconfig.api = _glfw.hints.minor;
    ctxconfig.major._0_1_ = _glfw.hints.forward != 0;
    ctxconfig.major._1_1_ = _glfw.hints.debug != 0;
    ctxconfig.minor = _glfw.hints.profile;
    ctxconfig._12_4_ = _glfw.hints.robustness;
    ctxconfig.profile = _glfw.hints.release;
    window._0_4_ = width;
    window._4_4_ = height;
    wndconfig._0_8_ = title;
    wndconfig._16_8_ = monitor;
    ctxconfig._24_8_ = share;
    GVar1 = _glfwIsValidContextConfig((_GLFWctxconfig *)&wndconfig.monitor);
    if (GVar1 == '\0') {
      _height_local = (_GLFWwindow *)0x0;
    }
    else {
      previous = (_GLFWwindow *)calloc(1,0x2c0);
      previous->next = _glfw.windowListHead;
      _glfw.windowListHead = previous;
      if (wndconfig._16_8_ != 0) {
        wndconfig.title._0_1_ = '\x01';
        wndconfig.title._1_1_ = '\x01';
        wndconfig.title._3_1_ = '\x01';
        (previous->videoMode).width = width;
        (previous->videoMode).height = height;
        (previous->videoMode).redBits = _glfw.hints.redBits;
        (previous->videoMode).greenBits = _glfw.hints.greenBits;
        (previous->videoMode).blueBits = _glfw.hints.blueBits;
        (previous->videoMode).refreshRate = _glfw.hints.refreshRate;
      }
      previous->monitor = (_GLFWmonitor *)wndconfig._16_8_;
      previous->resizable = (GLboolean)wndconfig.title;
      previous->decorated = wndconfig.title._2_1_;
      previous->autoIconify = wndconfig.title._4_1_;
      previous->floating = wndconfig.title._5_1_;
      previous->cursorMode = 0x34001;
      _height_1 = _glfwPlatformGetCurrentContext();
      wVar2 = _glfwPlatformCreateWindow
                        (previous,(_GLFWwndconfig *)&window,(_GLFWctxconfig *)&wndconfig.monitor,
                         (_GLFWfbconfig *)&ctxconfig.share);
      if (wVar2 == L'\0') {
        glfwDestroyWindow((GLFWwindow *)previous);
        _glfwPlatformMakeContextCurrent(_height_1);
        _height_local = (_GLFWwindow *)0x0;
      }
      else {
        _glfwPlatformMakeContextCurrent(previous);
        GVar1 = _glfwRefreshContextAttribs((_GLFWctxconfig *)&wndconfig.monitor);
        if (GVar1 == '\0') {
          glfwDestroyWindow((GLFWwindow *)previous);
          _glfwPlatformMakeContextCurrent(_height_1);
          _height_local = (_GLFWwindow *)0x0;
        }
        else {
          GVar1 = _glfwIsValidContext((_GLFWctxconfig *)&wndconfig.monitor);
          if (GVar1 == '\0') {
            glfwDestroyWindow((GLFWwindow *)previous);
            _glfwPlatformMakeContextCurrent(_height_1);
            _height_local = (_GLFWwindow *)0x0;
          }
          else {
            glClear(0x4000);
            _glfwPlatformSwapBuffers(previous);
            _glfwPlatformMakeContextCurrent(_height_1);
            if (wndconfig._16_8_ == 0) {
              if (wndconfig.title._1_1_ != '\0') {
                if (wndconfig.title._3_1_ == '\0') {
                  _glfwPlatformUnhideWindow(previous);
                }
                else {
                  _glfwPlatformShowWindow(previous);
                }
              }
            }
            else {
              _glfwPlatformGetWindowSize(previous,&local_d4,&local_d8);
              previous->cursorPosX = (double)(local_d4 / 2);
              previous->cursorPosY = (double)(local_d8 / 2);
              _glfwPlatformSetCursorPos(previous,previous->cursorPosX,previous->cursorPosY);
            }
            _height_local = previous;
          }
        }
      }
    }
  }
  return (GLFWwindow *)_height_local;
}

Assistant:

GLFWAPI GLFWwindow* glfwCreateWindow(int width, int height,
                                     const char* title,
                                     GLFWmonitor* monitor,
                                     GLFWwindow* share)
{
    _GLFWfbconfig fbconfig;
    _GLFWctxconfig ctxconfig;
    _GLFWwndconfig wndconfig;
    _GLFWwindow* window;
    _GLFWwindow* previous;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (width <= 0 || height <= 0)
    {
        _glfwInputError(GLFW_INVALID_VALUE, "Invalid window size");
        return NULL;
    }

    // Set up desired framebuffer config
    fbconfig.redBits        = _glfw.hints.redBits;
    fbconfig.greenBits      = _glfw.hints.greenBits;
    fbconfig.blueBits       = _glfw.hints.blueBits;
    fbconfig.alphaBits      = _glfw.hints.alphaBits;
    fbconfig.depthBits      = _glfw.hints.depthBits;
    fbconfig.stencilBits    = _glfw.hints.stencilBits;
    fbconfig.accumRedBits   = _glfw.hints.accumRedBits;
    fbconfig.accumGreenBits = _glfw.hints.accumGreenBits;
    fbconfig.accumBlueBits  = _glfw.hints.accumBlueBits;
    fbconfig.accumAlphaBits = _glfw.hints.accumAlphaBits;
    fbconfig.auxBuffers     = _glfw.hints.auxBuffers;
    fbconfig.stereo         = _glfw.hints.stereo ? GL_TRUE : GL_FALSE;
    fbconfig.samples        = _glfw.hints.samples;
    fbconfig.sRGB           = _glfw.hints.sRGB;
    fbconfig.doublebuffer   = _glfw.hints.doublebuffer ? GL_TRUE : GL_FALSE;

    // Set up desired window config
    wndconfig.width         = width;
    wndconfig.height        = height;
    wndconfig.title         = title;
    wndconfig.resizable     = _glfw.hints.resizable ? GL_TRUE : GL_FALSE;
    wndconfig.visible       = _glfw.hints.visible ? GL_TRUE : GL_FALSE;
    wndconfig.decorated     = _glfw.hints.decorated ? GL_TRUE : GL_FALSE;
    wndconfig.focused       = _glfw.hints.focused ? GL_TRUE : GL_FALSE;
    wndconfig.autoIconify   = _glfw.hints.autoIconify ? GL_TRUE : GL_FALSE;
    wndconfig.floating      = _glfw.hints.floating ? GL_TRUE : GL_FALSE;
    wndconfig.monitor       = (_GLFWmonitor*) monitor;

    // Set up desired context config
    ctxconfig.api           = _glfw.hints.api;
    ctxconfig.major         = _glfw.hints.major;
    ctxconfig.minor         = _glfw.hints.minor;
    ctxconfig.forward       = _glfw.hints.forward ? GL_TRUE : GL_FALSE;
    ctxconfig.debug         = _glfw.hints.debug ? GL_TRUE : GL_FALSE;
    ctxconfig.profile       = _glfw.hints.profile;
    ctxconfig.robustness    = _glfw.hints.robustness;
    ctxconfig.release       = _glfw.hints.release;
    ctxconfig.share         = (_GLFWwindow*) share;

    // Check the OpenGL bits of the window config
    if (!_glfwIsValidContextConfig(&ctxconfig))
        return NULL;

    window = calloc(1, sizeof(_GLFWwindow));
    window->next = _glfw.windowListHead;
    _glfw.windowListHead = window;

    if (wndconfig.monitor)
    {
        wndconfig.resizable = GL_TRUE;
        wndconfig.visible   = GL_TRUE;
        wndconfig.focused   = GL_TRUE;

        // Set up desired video mode
        window->videoMode.width       = width;
        window->videoMode.height      = height;
        window->videoMode.redBits     = _glfw.hints.redBits;
        window->videoMode.greenBits   = _glfw.hints.greenBits;
        window->videoMode.blueBits    = _glfw.hints.blueBits;
        window->videoMode.refreshRate = _glfw.hints.refreshRate;
    }

    // Transfer window hints that are persistent settings and not
    // just initial states
    window->monitor     = wndconfig.monitor;
    window->resizable   = wndconfig.resizable;
    window->decorated   = wndconfig.decorated;
    window->autoIconify = wndconfig.autoIconify;
    window->floating    = wndconfig.floating;
    window->cursorMode  = GLFW_CURSOR_NORMAL;

    // Save the currently current context so it can be restored later
    previous = _glfwPlatformGetCurrentContext();

    // Open the actual window and create its context
    if (!_glfwPlatformCreateWindow(window, &wndconfig, &ctxconfig, &fbconfig))
    {
        glfwDestroyWindow((GLFWwindow*) window);
        _glfwPlatformMakeContextCurrent(previous);
        return NULL;
    }

    _glfwPlatformMakeContextCurrent(window);

    // Retrieve the actual (as opposed to requested) context attributes
    if (!_glfwRefreshContextAttribs(&ctxconfig))
    {
        glfwDestroyWindow((GLFWwindow*) window);
        _glfwPlatformMakeContextCurrent(previous);
        return NULL;
    }

    // Verify the context against the requested parameters
    if (!_glfwIsValidContext(&ctxconfig))
    {
        glfwDestroyWindow((GLFWwindow*) window);
        _glfwPlatformMakeContextCurrent(previous);
        return NULL;
    }

    // Clearing the front buffer to black to avoid garbage pixels left over
    // from previous uses of our bit of VRAM
    glClear(GL_COLOR_BUFFER_BIT);
    _glfwPlatformSwapBuffers(window);

    // Restore the previously current context (or NULL)
    _glfwPlatformMakeContextCurrent(previous);

    if (wndconfig.monitor)
    {
        int width, height;
        _glfwPlatformGetWindowSize(window, &width, &height);

        window->cursorPosX = width / 2;
        window->cursorPosY = height / 2;

        _glfwPlatformSetCursorPos(window, window->cursorPosX, window->cursorPosY);
    }
    else
    {
        if (wndconfig.visible)
        {
            if (wndconfig.focused)
                _glfwPlatformShowWindow(window);
            else
                _glfwPlatformUnhideWindow(window);
        }
    }

    return (GLFWwindow*) window;
}